

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O2

ERROR_HANDLE error_clone(ERROR_HANDLE value)

{
  ERROR_HANDLE __ptr;
  AMQP_VALUE pAVar1;
  
  __ptr = (ERROR_HANDLE)malloc(8);
  if (__ptr != (ERROR_HANDLE)0x0) {
    pAVar1 = amqpvalue_clone(value->composite_value);
    __ptr->composite_value = pAVar1;
    if (pAVar1 != (AMQP_VALUE)0x0) {
      return __ptr;
    }
    free(__ptr);
  }
  return (ERROR_HANDLE)0x0;
}

Assistant:

ERROR_HANDLE error_clone(ERROR_HANDLE value)
{
    ERROR_INSTANCE* error_instance = (ERROR_INSTANCE*)malloc(sizeof(ERROR_INSTANCE));
    if (error_instance != NULL)
    {
        error_instance->composite_value = amqpvalue_clone(((ERROR_INSTANCE*)value)->composite_value);
        if (error_instance->composite_value == NULL)
        {
            free(error_instance);
            error_instance = NULL;
        }
    }

    return error_instance;
}